

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reliability_Header.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Reliability_Header::Encode(Reliability_Header *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  Reliability_Header *this_local;
  
  pKVar1 = KDataStream::operator<<(stream,this->m_ui8ReqRelSrv);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui16Padding1);
  KDataStream::operator<<(pKVar1,this->m_ui8Padding);
  return;
}

Assistant:

void Reliability_Header::Encode( KDataStream & stream ) const
{
    stream << m_ui8ReqRelSrv
           << m_ui16Padding1
           << m_ui8Padding;
}